

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_228a::floatffArithmeticTest_ResultHasCorrectType_Test::TestBody
          (floatffArithmeticTest_ResultHasCorrectType_Test *this)

{
  return;
}

Assistant:

TEST(floatffArithmeticTest, ResultHasCorrectType)
{
    using doubleff = flexfloat<11, 52>;
    using floatff = flexfloat<8, 23>;

    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() + doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() - doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() * doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() / doubleff())>();

    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() + floatff())>();
    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() - floatff())>();
    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() * floatff())>();
    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() / floatff())>();

    doubleff dlhs;
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs += doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs -= doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs *= doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs /= doubleff())>();
    floatff flhs;
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs += floatff())>();
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs -= floatff())>();
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs *= floatff())>();
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs /= floatff())>();
}